

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  png_XYZ XYZ;
  png_xy xy;
  png_XYZ local_b8;
  uint local_88;
  int local_84;
  int local_80;
  uint local_7c;
  png_xy local_78;
  png_XYZ local_58;
  
  iVar8 = XYZ_in->blue_Z;
  lVar4._0_4_ = XYZ_in->red_X;
  lVar4._4_4_ = XYZ_in->red_Y;
  lVar5._0_4_ = XYZ_in->red_Z;
  lVar5._4_4_ = XYZ_in->green_X;
  lVar6._0_4_ = XYZ_in->green_Y;
  lVar6._4_4_ = XYZ_in->green_Z;
  lVar7._0_4_ = XYZ_in->blue_X;
  lVar7._4_4_ = XYZ_in->blue_Y;
  local_b8._0_8_ = lVar4;
  local_b8._8_8_ = lVar5;
  local_b8._16_8_ = lVar6;
  local_b8._24_8_ = lVar7;
  local_b8.blue_Z = iVar8;
  if ((((((-1 < lVar4) && (-1 < (int)(undefined4)lVar6)) && (-1 < lVar7)) &&
       ((-1 < (int)(undefined4)lVar4 && (-1 < lVar5)))) &&
      ((-1 < (int)(undefined4)lVar7 && ((-1 < (int)lVar5 && (-1 < lVar6)))))) &&
     (((uint)lVar5._4_4_ <= (lVar4._4_4_ ^ 0x7fffffff) && -1 < iVar8 &&
      (((uint)(undefined4)lVar7 <= ((undefined4)lVar6 + lVar4._4_4_ ^ 0x7fffffff) &&
       (iVar9 = (undefined4)lVar6 + lVar4._4_4_ + lVar7._4_4_, iVar9 != 0)))))) {
    if (iVar9 != 100000) {
      local_7c = lVar5._4_4_;
      dVar3 = (double)iVar9;
      iVar9 = 0;
      local_88 = (undefined4)lVar7;
      local_84 = lVar6._4_4_;
      if ((undefined4)lVar4 != 0) {
        local_80 = (int)lVar5;
        dVar2 = floor(((double)(int)(undefined4)lVar4 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar9 = (int)dVar2;
        lVar5._0_4_ = local_80;
      }
      iVar10 = 0;
      local_b8.red_X = iVar9;
      if (lVar4._4_4_ != 0) {
        dVar2 = floor(((double)(int)lVar4._4_4_ * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar10 = (int)dVar2;
      }
      local_b8.red_Y = iVar10;
      iVar10 = 0;
      iVar9 = 0;
      if ((int)lVar5 != 0) {
        dVar2 = floor(((double)(int)lVar5 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar9 = (int)dVar2;
      }
      local_b8.red_Z = iVar9;
      if (local_7c != 0) {
        dVar2 = floor(((double)(int)local_7c * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar10 = (int)dVar2;
      }
      local_b8.green_X = iVar10;
      iVar9 = 0;
      lVar5._0_4_ = 0;
      if ((undefined4)lVar6 != 0) {
        dVar2 = floor(((double)(int)(undefined4)lVar6 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        lVar5._0_4_ = (int)dVar2;
      }
      local_b8.green_Y = (int)lVar5;
      if (local_84 != 0) {
        dVar2 = floor(((double)local_84 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar9 = (int)dVar2;
      }
      local_b8.green_Z = iVar9;
      iVar9 = 0;
      lVar5._0_4_ = 0;
      if (local_88 != 0) {
        dVar2 = floor(((double)(int)local_88 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        lVar5._0_4_ = (int)dVar2;
      }
      local_b8.blue_X = (int)lVar5;
      if (lVar7._4_4_ != 0) {
        dVar2 = floor(((double)(int)lVar7._4_4_ * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar2) || (dVar2 < -2147483648.0)) goto LAB_002bbe01;
        iVar9 = (int)dVar2;
      }
      local_b8.blue_Y = iVar9;
      if (iVar8 == 0) {
        local_b8.blue_Z = 0;
      }
      else {
        dVar3 = floor(((double)iVar8 * 100000.0) / dVar3 + 0.5);
        if ((2147483647.0 < dVar3) || (dVar3 < -2147483648.0)) goto LAB_002bbe01;
        local_b8.blue_Z = (png_fixed_point)dVar3;
      }
    }
    iVar8 = png_xy_from_XYZ(&local_78,&local_b8);
    if (iVar8 == 0) {
      local_58.blue_Z = local_b8.blue_Z;
      local_58.green_Y = local_b8.green_Y;
      local_58.green_Z = local_b8.green_Z;
      local_58.blue_X = local_b8.blue_X;
      local_58.blue_Y = local_b8.blue_Y;
      local_58.red_X = local_b8.red_X;
      local_58.red_Y = local_b8.red_Y;
      local_58.red_Z = local_b8.red_Z;
      local_58.green_X = local_b8.green_X;
      iVar8 = png_colorspace_check_xy(&local_58,&local_78);
      if (iVar8 != 1) {
        if (iVar8 == 0) {
          iVar8 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,&local_78,&local_b8,preferred);
          return iVar8;
        }
        pbVar1 = (byte *)((long)&colorspace->flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
        png_error(png_ptr,"internal error checking chromaticities");
      }
    }
  }
LAB_002bbe01:
  pbVar1 = (byte *)((long)&colorspace->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  png_benign_error(png_ptr,"invalid end points");
  return 0;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}